

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall ChainstateManager::IsInitialBlockDownload(ChainstateManager *this)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  strong_ordering sVar3;
  CChain *flag;
  CBlockIndex *pCVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> this_00;
  ConstevalFormatString<0U> in_RDI;
  long in_FS_OFFSET;
  CChain *chain;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  base_uint<256U> *in_stack_fffffffffffffef0;
  memory_order in_stack_fffffffffffffef8;
  memory_order in_stack_fffffffffffffefc;
  undefined1 __i;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  strong_ordering sVar5;
  undefined8 in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff5c;
  int source_line;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar6;
  char *in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::atomic<bool>::load
                    ((atomic<bool> *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                     in_stack_fffffffffffffefc);
  if (bVar2) {
    bVar6 = 0;
  }
  else {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff08 >> 0x18,0));
    bVar2 = std::atomic<bool>::load
                      ((atomic<bool> *)
                       CONCAT17(in_stack_ffffffffffffff07,
                                CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                       in_stack_fffffffffffffefc);
    if (bVar2) {
      bVar6 = 0;
    }
    else {
      bVar2 = ::node::BlockManager::LoadingBlocks
                        ((BlockManager *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      source_line = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff5c);
      if (bVar2) {
        bVar6 = 1;
      }
      else {
        flag = ActiveChain((ChainstateManager *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        pCVar4 = CChain::Tip((CChain *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                            );
        if (pCVar4 == (CBlockIndex *)0x0) {
          bVar6 = 1;
        }
        else {
          CChain::Tip((CChain *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          MinimumChainWork((ChainstateManager *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          bVar2 = ::operator<((base_uint<256U> *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              in_stack_fffffffffffffef0);
          if (bVar2) {
            bVar6 = 1;
          }
          else {
            CChain::Tip((CChain *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            CBlockIndex::Time((CBlockIndex *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            __i = (undefined1)(in_stack_fffffffffffffefc >> 0x18);
            Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
            this_00 = std::chrono::operator-
                                ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                  *)in_stack_fffffffffffffef0,
                                 (duration<long,_std::ratio<1L,_1L>_> *)
                                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
            sVar3 = std::chrono::
                    operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                              ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                *)in_stack_fffffffffffffef0,
                               (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
            sVar5 = sVar3;
            std::__cmp_cat::__unspec::__unspec
                      ((__unspec *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       (__unspec *)0x7ce397);
            bVar2 = std::operator<(sVar3._M_value);
            if (bVar2) {
              bVar6 = 1;
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)this_00.__d.__r,
                         (char *)CONCAT17(sVar5._M_value,
                                          CONCAT16(in_stack_ffffffffffffff06,
                                                   in_stack_ffffffffffffff00)));
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)this_00.__d.__r,
                         (char *)CONCAT17(sVar5._M_value,
                                          CONCAT16(in_stack_ffffffffffffff06,
                                                   in_stack_ffffffffffffff00)));
              in_stack_fffffffffffffee8 = 2;
              source_file._M_len._7_1_ = in_stack_ffffffffffffffa7;
              source_file._M_len._0_7_ = in_stack_ffffffffffffffa0;
              source_file._M_str = in_stack_ffffffffffffffa8;
              LogPrintFormatInternal<>
                        (in_stack_ffffffffffffffb0,source_file,source_line,(LogFlags)flag,
                         (Level)chain,in_RDI);
              std::atomic<bool>::store
                        ((atomic<bool> *)
                         CONCAT17(sVar5._M_value,
                                  CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                         (bool)__i,in_stack_fffffffffffffef8);
              bVar6 = 0;
            }
          }
        }
      }
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::IsInitialBlockDownload() const
{
    // Optimization: pre-test latch before taking the lock.
    if (m_cached_finished_ibd.load(std::memory_order_relaxed))
        return false;

    LOCK(cs_main);
    if (m_cached_finished_ibd.load(std::memory_order_relaxed))
        return false;
    if (m_blockman.LoadingBlocks()) {
        return true;
    }
    CChain& chain{ActiveChain()};
    if (chain.Tip() == nullptr) {
        return true;
    }
    if (chain.Tip()->nChainWork < MinimumChainWork()) {
        return true;
    }
    if (chain.Tip()->Time() < Now<NodeSeconds>() - m_options.max_tip_age) {
        return true;
    }
    LogPrintf("Leaving InitialBlockDownload (latching to false)\n");
    m_cached_finished_ibd.store(true, std::memory_order_relaxed);
    return false;
}